

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Gl_Choice.cxx
# Opt level: O0

Fl_Gl_Choice * Fl_Gl_Choice::find(int m,int *alistp)

{
  XVisualInfo *pXVar1;
  char *pcVar2;
  Colormap CVar3;
  int iVar4;
  XVisualInfo *visp;
  int local_b8;
  int n;
  int list [32];
  int *local_30;
  int *blist;
  Fl_Gl_Choice *g;
  int *alistp_local;
  Fl_Gl_Choice *pFStack_10;
  int m_local;
  
  blist = &::first->mode;
  while( true ) {
    if (blist == (int *)0x0) {
      local_30 = alistp;
      if (alistp == (int *)0x0) {
        if ((m & 1U) == 0) {
          local_b8 = 4;
          n = 9;
          list[0] = 1;
          if ((m & 0x40U) != 0) {
            list[0] = 8;
          }
          visp._4_4_ = 3;
          if ((m & 8U) != 0) {
            list[1] = 0xb;
            list[2] = 1;
            if ((m & 0x40U) != 0) {
              list[2] = 8;
            }
            visp._4_4_ = 5;
          }
          iVar4 = visp._4_4_;
          if ((m & 4U) != 0) {
            (&local_b8)[visp._4_4_] = 0xf;
            (&local_b8)[visp._4_4_ + 1] = 1;
            iVar4 = visp._4_4_ + 2;
            if ((m & 8U) != 0) {
              (&local_b8)[visp._4_4_ + 2] = 0x11;
              (&local_b8)[visp._4_4_ + 3] = 1;
              iVar4 = visp._4_4_ + 4;
            }
          }
        }
        else {
          local_b8 = 2;
          n = 8;
          iVar4 = 2;
        }
        visp._4_4_ = iVar4;
        if ((m & 2U) != 0) {
          (&local_b8)[visp._4_4_] = 5;
          visp._4_4_ = visp._4_4_ + 1;
        }
        if ((m & 0x10U) != 0) {
          iVar4 = visp._4_4_ + 1;
          (&local_b8)[visp._4_4_] = 0xc;
          visp._4_4_ = visp._4_4_ + 2;
          (&local_b8)[iVar4] = 1;
        }
        if ((m & 0x20U) != 0) {
          iVar4 = visp._4_4_ + 1;
          (&local_b8)[visp._4_4_] = 0xd;
          visp._4_4_ = visp._4_4_ + 2;
          (&local_b8)[iVar4] = 1;
        }
        if ((m & 0x100U) != 0) {
          (&local_b8)[visp._4_4_] = 6;
          visp._4_4_ = visp._4_4_ + 1;
        }
        if ((m & 0x80U) != 0) {
          iVar4 = visp._4_4_ + 1;
          (&local_b8)[visp._4_4_] = 0x186a1;
          visp._4_4_ = visp._4_4_ + 2;
          (&local_b8)[iVar4] = 4;
        }
        (&local_b8)[visp._4_4_] = 0;
        local_30 = &local_b8;
      }
      fl_open_display();
      pXVar1 = (XVisualInfo *)glXChooseVisual(fl_display,fl_screen,local_30);
      if (pXVar1 == (XVisualInfo *)0x0) {
        if ((m & 0x80U) == 0) {
          pFStack_10 = (Fl_Gl_Choice *)0x0;
        }
        else {
          pFStack_10 = find(m & 0xffffff7f,(int *)0x0);
        }
      }
      else {
        pFStack_10 = (Fl_Gl_Choice *)operator_new(0x28);
        pFStack_10->mode = m;
        pFStack_10->alist = alistp;
        pFStack_10->next = ::first;
        ::first = pFStack_10;
        pFStack_10->vis = pXVar1;
        if ((pXVar1->visualid == fl_visual->visualid) &&
           (pcVar2 = fl_getenv("MESA_PRIVATE_CMAP"), pcVar2 == (char *)0x0)) {
          pFStack_10->colormap = fl_colormap;
        }
        else {
          CVar3 = XCreateColormap(fl_display,
                                  *(undefined8 *)
                                   (*(long *)(fl_display + 0xe8) + (long)fl_screen * 0x80 + 0x10),
                                  pXVar1->visual,0);
          pFStack_10->colormap = CVar3;
        }
      }
      return pFStack_10;
    }
    if ((*blist == m) && (*(int **)(blist + 2) == alistp)) break;
    blist = *(int **)(blist + 4);
  }
  return (Fl_Gl_Choice *)blist;
}

Assistant:

Fl_Gl_Choice *Fl_Gl_Choice::find(int m, const int *alistp) {
  Fl_Gl_Choice *g;
  
  for (g = first; g; g = g->next)
    if (g->mode == m && g->alist == alistp) 
      return g;

#if defined(USE_X11)    
  const int *blist;
  int list[32];
    
  if (alistp)
    blist = alistp;
  else {
    int n = 0;
    if (m & FL_INDEX) {
      list[n++] = GLX_BUFFER_SIZE;
      list[n++] = 8; // glut tries many sizes, but this should work...
    } else {
      list[n++] = GLX_RGBA;
      list[n++] = GLX_GREEN_SIZE;
      list[n++] = (m & FL_RGB8) ? 8 : 1;
      if (m & FL_ALPHA) {
	list[n++] = GLX_ALPHA_SIZE;
	list[n++] = (m & FL_RGB8) ? 8 : 1;
      }
      if (m & FL_ACCUM) {
	list[n++] = GLX_ACCUM_GREEN_SIZE;
	list[n++] = 1;
	if (m & FL_ALPHA) {
	  list[n++] = GLX_ACCUM_ALPHA_SIZE;
	  list[n++] = 1;
	}
      }
    }
    if (m & FL_DOUBLE) {
      list[n++] = GLX_DOUBLEBUFFER;
    }
    if (m & FL_DEPTH) {
      list[n++] = GLX_DEPTH_SIZE; list[n++] = 1;
    }
    if (m & FL_STENCIL) {
      list[n++] = GLX_STENCIL_SIZE; list[n++] = 1;
    }
    if (m & FL_STEREO) {
      list[n++] = GLX_STEREO;
    }
#    if defined(GLX_VERSION_1_1) && defined(GLX_SGIS_multisample)
    if (m & FL_MULTISAMPLE) {
      list[n++] = GLX_SAMPLES_SGIS;
      list[n++] = 4; // value Glut uses
    }
#    endif
    list[n] = 0;
    blist = list;
  }
    
  fl_open_display();
  XVisualInfo *visp = glXChooseVisual(fl_display, fl_screen, (int *)blist);
  if (!visp) {
#    if defined(GLX_VERSION_1_1) && defined(GLX_SGIS_multisample)
    if (m&FL_MULTISAMPLE) return find(m&~FL_MULTISAMPLE,0);
#    endif
    return 0;
  }

#elif defined(__APPLE_QUARTZ__)
  NSOpenGLPixelFormat* fmt = Fl_X::mode_to_NSOpenGLPixelFormat(m, alistp);
  if (!fmt) return 0;
  
#elif defined(WIN32)

  // Replacement for ChoosePixelFormat() that finds one with an overlay
  // if possible:
  if (!fl_gc) fl_GetDC(0);
  int pixelformat = 0;
  PIXELFORMATDESCRIPTOR chosen_pfd;
  for (int i = 1; ; i++) {
    PIXELFORMATDESCRIPTOR pfd;
    if (!DescribePixelFormat(fl_gc, i, sizeof(pfd), &pfd)) break;
    // continue if it does not satisfy our requirements:
    if (~pfd.dwFlags & (PFD_DRAW_TO_WINDOW | PFD_SUPPORT_OPENGL)) continue;
    if (pfd.iPixelType != ((m&FL_INDEX)?PFD_TYPE_COLORINDEX:PFD_TYPE_RGBA)) continue;
    if ((m & FL_ALPHA) && !pfd.cAlphaBits) continue;
    if ((m & FL_ACCUM) && !pfd.cAccumBits) continue;
    if ((!(m & FL_DOUBLE)) != (!(pfd.dwFlags & PFD_DOUBLEBUFFER))) continue;
    if ((!(m & FL_STEREO)) != (!(pfd.dwFlags & PFD_STEREO))) continue;
    if ((m & FL_DEPTH) && !pfd.cDepthBits) continue;
    if ((m & FL_STENCIL) && !pfd.cStencilBits) continue;
    // see if better than the one we have already:
    if (pixelformat) {
      // offering non-generic rendering is better (read: hardware accelleration)
      if (!(chosen_pfd.dwFlags & PFD_GENERIC_FORMAT) &&
          (pfd.dwFlags & PFD_GENERIC_FORMAT)) continue;
      // offering overlay is better:
      else if (!(chosen_pfd.bReserved & 15) && (pfd.bReserved & 15)) {}
      // otherwise more bit planes is better:
      else if (chosen_pfd.cColorBits > pfd.cColorBits) continue;
      else if (chosen_pfd.cDepthBits > pfd.cDepthBits) continue;
    }
    pixelformat = i;
    chosen_pfd = pfd;
  }
  //printf("Chosen pixel format is %d\n", pixelformat);
  if (!pixelformat) return 0;
#else
# error platform unsupported
#endif

  g = new Fl_Gl_Choice;
  g->mode = m;
  g->alist = alistp;
  g->next = first;
  first = g;

#if defined(USE_X11)
  g->vis = visp;

  if (/*MaxCmapsOfScreen(ScreenOfDisplay(fl_display,fl_screen))==1 && */
      visp->visualid == fl_visual->visualid &&
      !fl_getenv("MESA_PRIVATE_CMAP"))
    g->colormap = fl_colormap;
  else
    g->colormap = XCreateColormap(fl_display, RootWindow(fl_display,fl_screen),
				  visp->visual, AllocNone);
#  elif defined(WIN32)
  g->pixelformat = pixelformat;
  g->pfd = chosen_pfd;
#  elif defined(__APPLE_QUARTZ__)
  g->pixelformat = fmt;
#  else
#    error unsupported platform
#  endif

  return g;
}